

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

int32_t __thiscall
SQCompilation::NodeDiffComputer::diffDoWhile
          (NodeDiffComputer *this,DoWhileStatement *lhs,DoWhileStatement *rhs)

{
  int32_t iVar1;
  Node *rhs_00;
  DoWhileStatement *in_RDX;
  DoWhileStatement *in_RSI;
  Node *in_RDI;
  int32_t condDiff;
  int32_t bodyDiff;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int32_t local_4;
  
  rhs_00 = &LoopStatement::body(&in_RSI->super_LoopStatement)->super_Node;
  LoopStatement::body(&in_RDX->super_LoopStatement);
  iVar1 = diffNodes((NodeDiffComputer *)
                    CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),in_RDI,rhs_00);
  local_4 = iVar1;
  if (iVar1 <= in_RDI[1]._coordinates.columnStart) {
    DoWhileStatement::condition(in_RSI);
    DoWhileStatement::condition(in_RDX);
    local_4 = diffNodes((NodeDiffComputer *)CONCAT44(iVar1,in_stack_ffffffffffffffd8),in_RDI,rhs_00)
    ;
    if (local_4 <= in_RDI[1]._coordinates.columnStart) {
      local_4 = iVar1 + local_4;
    }
  }
  return local_4;
}

Assistant:

int32_t diffDoWhile(const DoWhileStatement *lhs, const DoWhileStatement *rhs) {
    int32_t bodyDiff = diffNodes(lhs->body(), rhs->body());

    if (bodyDiff > limit)
      return bodyDiff;

    int32_t condDiff = diffNodes(lhs->condition(), rhs->condition());

    if (condDiff > limit)
      return condDiff;

    return bodyDiff + condDiff;
  }